

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O3

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>
::MarkArguments(ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>
                *this,BasicFlatConverter *cvt)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  
  if ((this->super_BasicConstraintKeeper).acc_level_expr_ < 0) {
    uVar1 = (this->super_BasicConstraintKeeper).acc_level_item_;
    uVar3 = 0;
    if (uVar1 != 0xfffffffe) {
      uVar3 = uVar1;
    }
    if ((int)uVar3 < 0) {
      uVar3 = (this->super_BasicConstraintKeeper).acc_level_default_;
      iVar2 = (*(this->super_BasicConstraintKeeper)._vptr_BasicConstraintKeeper[0x13])(this);
      if (-1 < iVar2) {
        uVar3 = (*(this->super_BasicConstraintKeeper)._vptr_BasicConstraintKeeper[0x13])(this);
      }
    }
    if (4 < uVar3) {
      std::__throw_out_of_range_fmt
                ("array::at: __n (which is %zu) >= _Nm (which is %zu)",(long)(int)uVar3,5);
    }
    (this->super_BasicConstraintKeeper).acc_level_expr_ =
         *(int *)(&DAT_004a15c4 + (long)(int)uVar3 * 4);
  }
  return;
}

Assistant:

void DoMarkForArguments() {
    const auto eal        // expr only
        = GetChosenAcceptanceLevelEXPR();
    for (int i=0; i< (int)cons_.size(); ++i) {
      const auto& cnt = cons_[i];
      if (!cnt.IsRedundant()) {      // Delegate actual logic to Converter
        const auto& con = cnt.GetCon();
        GetConverter().ConsiderMarkingArguments(con, i, eal);
      }
    }
  }